

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parsePostIncDec(StructuralParser *this,Expression *lhs,bool isIncrement)

{
  PreOrPostIncOrDec *pPVar1;
  bool local_22;
  bool local_21;
  Context local_20;
  
  local_20.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_20.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_20.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_20.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_20.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_20.parentScope = this->currentScope;
  local_21 = true;
  local_22 = isIncrement;
  pPVar1 = PoolAllocator::
           allocate<soul::AST::PreOrPostIncOrDec,soul::AST::Context,soul::AST::Expression&,bool&,bool>
                     (&this->allocator->pool,&local_20,lhs,&local_22,&local_21);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_20.location.sourceCode.object);
  return &pPVar1->super_Expression;
}

Assistant:

AST::Expression& parsePostIncDec (AST::Expression& lhs, bool isIncrement)
    {
        return allocate<AST::PreOrPostIncOrDec> (getContext(), lhs, isIncrement, true);
    }